

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::InvalidateDependand(CodeGenGenericContext *this,x86XmmReg dreg)

{
  ulong uVar1;
  MemCache *entry;
  uint local_18;
  uint i_1;
  uint i;
  x86XmmReg dreg_local;
  CodeGenGenericContext *this_local;
  
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    if ((this->xmmReg[local_18].type == argReg) && (this->xmmReg[local_18].field_1.reg == dreg)) {
      this->xmmReg[local_18].type = argPtrLabel;
    }
  }
  for (entry._4_4_ = 0; entry._4_4_ < 0x10; entry._4_4_ = entry._4_4_ + 1) {
    uVar1 = (ulong)entry._4_4_;
    if ((this->memCache[uVar1].value.type == argXmmReg) &&
       (this->memCache[uVar1].value.field_1.reg == dreg)) {
      this->memCache[uVar1].value.type = argNone;
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::InvalidateDependand(x86XmmReg dreg)
{
	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		if(xmmReg[i].type == x86Argument::argReg && xmmReg[i].xmmArg == dreg)
			xmmReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.value.type == x86Argument::argXmmReg && entry.value.xmmArg == dreg)
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}
	}
}